

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchingWorksWithExtensions_Test::TestBody
          (MatchingTest_MatchingWorksWithExtensions_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  FileDescriptor *this_00;
  FieldDescriptor *this_01;
  char *pcVar3;
  FieldDescriptor *key;
  MutableType pTVar4;
  char *in_R9;
  AssertHelper local_300;
  Message local_2f8;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar;
  MessageDifferencer differencer;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  FieldDescriptor *nested_key;
  FieldDescriptor *desc;
  FileDescriptor *descriptor;
  NestedMessage *nested;
  undefined1 local_70 [8];
  TestAllExtensions msg2;
  TestAllExtensions msg1;
  MatchingTest_MatchingWorksWithExtensions_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&msg2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_70);
  pDVar2 = proto2_unittest::TestAllExtensions::GetDescriptor();
  this_00 = Descriptor::file(pDVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "repeated_nested_message_extension");
  this_01 = FileDescriptor::FindExtensionByName(this_00,stack0xffffffffffffff50);
  local_c1 = this_01 != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_c0,(AssertionResult *)"desc == nullptr","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1085,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  if (bVar1) {
    pDVar2 = FieldDescriptor::message_type(this_01);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&differencer.unpack_any_field_,
               "bb");
    key = Descriptor::FindFieldByName(pDVar2,stack0xfffffffffffffef0);
    util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar.message_);
    util::MessageDifferencer::TreatAsMap((MessageDifferencer *)&gtest_ar.message_,this_01,key);
    pTVar4 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       ((TestAllExtensions *)&msg2.field_0._impl_._cached_size_,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                         *)proto2_unittest::repeated_nested_message_extension);
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,7);
    pTVar4 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       ((TestAllExtensions *)&msg2.field_0._impl_._cached_size_,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                         *)proto2_unittest::repeated_nested_message_extension);
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,0xd);
    pTVar4 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       ((TestAllExtensions *)&msg2.field_0._impl_._cached_size_,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                         *)proto2_unittest::repeated_nested_message_extension);
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,0xb);
    pTVar4 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       ((TestAllExtensions *)local_70,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                         *)proto2_unittest::repeated_nested_message_extension);
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,0xb);
    pTVar4 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       ((TestAllExtensions *)local_70,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                         *)proto2_unittest::repeated_nested_message_extension);
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,0xd);
    pTVar4 = proto2_unittest::TestAllExtensions::
             AddExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                       ((TestAllExtensions *)local_70,
                        (ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                         *)proto2_unittest::repeated_nested_message_extension);
    proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar4,7);
    protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
              (&local_2f0,this,(MessageDifferencer *)&gtest_ar.message_,
               (Message *)&msg2.field_0._impl_._cached_size_,(Message *)local_70,true);
    testing::internal::EqHelper::
    Compare<char[680],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_2d0,
               "\"matched: (proto2_unittest.repeated_nested_message_extension)[0].bb ->\" \" (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\\n\" \"moved: (proto2_unittest.repeated_nested_message_extension)[0] ->\" \" (proto2_unittest.repeated_nested_message_extension)[2] :\" \" { bb: 7 }\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[1].bb :\" \" 13\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[1] :\" \" { bb: 13 }\\n\" \"matched: (proto2_unittest.repeated_nested_message_extension)[2].bb ->\" \" (proto2_unittest.repeated_nested_message_extension)[0].bb :\" \" 11\\n\" \"moved: (proto2_unittest.repeated_nested_message_extension)[2] ->\" \" (proto2_unittest.repeated_nested_message_extension)[0] :\" \" { bb: 11 }\\n\""
               ,"RunWithResult(&differencer, msg1, msg2, true)",
               (char (*) [680])
               "matched: (proto2_unittest.repeated_nested_message_extension)[0].bb -> (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\nmoved: (proto2_unittest.repeated_nested_message_extension)[0] -> (proto2_unittest.repeated_nested_message_extension)[2] : { bb: 7 }\nmatched: (proto2_unittest.repeated_nested_message_extension)[1].bb : 13\nmatched: (proto2_unittest.repeated_nested_message_extension)[1] : { bb: 13 }\nmatched: (proto2_unittest.repeated_nested_message_extension)[2].bb -> (proto2_unittest.repeated_nested_message_extension)[0].bb : 11\nmoved: (proto2_unittest.repeated_nested_message_extension)[2] -> (proto2_unittest.repeated_nested_message_extension)[0] : { bb: 11 }\n"
               ,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
    if (!bVar1) {
      testing::Message::Message(&local_2f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
      testing::internal::AssertHelper::AssertHelper
                (&local_300,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0x10a8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
      testing::internal::AssertHelper::~AssertHelper(&local_300);
      testing::Message::~Message(&local_2f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
    util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar.message_);
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_70);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&msg2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST_F(MatchingTest, MatchingWorksWithExtensions) {
  proto2_unittest::TestAllExtensions msg1, msg2;
  proto2_unittest::TestAllTypes::NestedMessage* nested;
  using proto2_unittest::repeated_nested_message_extension;

  const FileDescriptor* descriptor;
  const FieldDescriptor* desc;
  const FieldDescriptor* nested_key;
  descriptor = msg1.GetDescriptor()->file();
  desc = descriptor->FindExtensionByName("repeated_nested_message_extension");
  ASSERT_FALSE(desc == nullptr);
  nested_key = desc->message_type()->FindFieldByName("bb");

  MessageDifferencer differencer;
  differencer.TreatAsMap(desc, nested_key);

  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(7);
  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(13);
  nested = msg1.AddExtension(repeated_nested_message_extension);
  nested->set_bb(11);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(11);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(13);
  nested = msg2.AddExtension(repeated_nested_message_extension);
  nested->set_bb(7);

  EXPECT_EQ(
      "matched: (proto2_unittest.repeated_nested_message_extension)[0].bb ->"
      " (proto2_unittest.repeated_nested_message_extension)[2].bb : 7\n"
      "moved: (proto2_unittest.repeated_nested_message_extension)[0] ->"
      " (proto2_unittest.repeated_nested_message_extension)[2] :"
      " { bb: 7 }\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[1].bb :"
      " 13\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[1] :"
      " { bb: 13 }\n"
      "matched: (proto2_unittest.repeated_nested_message_extension)[2].bb ->"
      " (proto2_unittest.repeated_nested_message_extension)[0].bb :"
      " 11\n"
      "moved: (proto2_unittest.repeated_nested_message_extension)[2] ->"
      " (proto2_unittest.repeated_nested_message_extension)[0] :"
      " { bb: 11 }\n",
      RunWithResult(&differencer, msg1, msg2, true));
}